

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O2

ssize_t __thiscall
kj::anon_unknown_36::HttpFixedLengthEntityWriter::write
          (HttpFixedLengthEntityWriter *this,int __fd,void *__buf,size_t __n)

{
  Coroutine<void> *this_00;
  PromiseAwaiter<void> *__return_storage_ptr__;
  ulong *puVar1;
  _func_int **pp_Var2;
  SourceLocation location;
  bool bVar3;
  coroutine_handle<void> handle;
  HttpOutputStream *pHVar4;
  _func_int **pp_Var5;
  long lVar6;
  undefined4 in_register_00000034;
  HttpEntityBodyWriter *this_01;
  void *pvVar7;
  HttpOutputStream *this_02;
  ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_> pieces;
  Fault f;
  DebugComparison<unsigned_long_&,_unsigned_long_&> _kjCondition;
  Fault local_68;
  DebugComparison<unsigned_long_&,_unsigned_long_&> local_60;
  HttpFixedLengthEntityWriter *local_38;
  
  this_01 = (HttpEntityBodyWriter *)CONCAT44(in_register_00000034,__fd);
  handle._M_fr_ptr = operator_new(0x410);
  *(code **)handle._M_fr_ptr = write;
  *(code **)((long)handle._M_fr_ptr + 8) = write;
  this_00 = (Coroutine<void> *)((long)handle._M_fr_ptr + 0x10);
  *(HttpEntityBodyWriter **)((long)handle._M_fr_ptr + 0x400) = this_01;
  local_60.left = (unsigned_long *)0x4d3fd6;
  local_60.right = (unsigned_long *)0x4a33ea;
  local_60.op.content.ptr = (char *)0x11000009b1;
  location.function = "write";
  location.fileName =
       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
  ;
  location.lineNumber = 0x9b1;
  location.columnNumber = 0x11;
  kj::_::Coroutine<void>::Coroutine(this_00,handle,location);
  local_38 = this;
  kj::_::Coroutine<void>::get_return_object((Coroutine<void> *)this);
  __return_storage_ptr__ = (PromiseAwaiter<void> *)((long)handle._M_fr_ptr + 0x238);
  puVar1 = (ulong *)((long)handle._M_fr_ptr + 0x3f0);
  this_02 = (HttpOutputStream *)((long)handle._M_fr_ptr + 0x3f8);
  *puVar1 = 0;
  pp_Var5 = (_func_int **)0x0;
  pvVar7 = __buf;
  for (lVar6 = __n << 4; lVar6 != 0; lVar6 = lVar6 + -0x10) {
    pp_Var5 = (_func_int **)((long)pp_Var5 + *(long *)((long)pvVar7 + 8));
    *puVar1 = (ulong)pp_Var5;
    pvVar7 = (void *)((long)pvVar7 + 0x10);
  }
  if (pp_Var5 == (_func_int **)0x0) {
    kj::_::CoroutineMixin<kj::_::Coroutine<void>,_void>::return_void
              ((CoroutineMixin<kj::_::Coroutine<void>,_void> *)this_00);
  }
  else {
    local_60.right = (unsigned_long *)(this_01 + 1);
    pp_Var2 = this_01[1].super_AsyncOutputStream._vptr_AsyncOutputStream;
    local_60.op.content.ptr = " <= ";
    local_60.op.content.size_ = 5;
    local_60.result = pp_Var2 >= pp_Var5;
    local_60.left = puVar1;
    if (pp_Var2 < pp_Var5) {
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long&,unsigned_long&>&,char_const(&)[25]>
                (&local_68,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
                 ,0x9b6,FAILED,"size <= length","_kjCondition,\"overwrote Content-Length\"",
                 &local_60,(char (*) [25])"overwrote Content-Length");
      kj::_::Debug::Fault::fatal(&local_68);
    }
    this_01[1].super_AsyncOutputStream._vptr_AsyncOutputStream =
         (_func_int **)((long)pp_Var2 - (long)pp_Var5);
    pHVar4 = HttpEntityBodyWriter::getInner(this_01);
    pieces.size_ = (size_t)__buf;
    pieces.ptr = (ArrayPtr<const_unsigned_char> *)pHVar4;
    HttpOutputStream::writeBodyData(this_02,pieces);
    co_await<void>(__return_storage_ptr__,(Promise<void> *)this_02);
    *(undefined1 *)((long)handle._M_fr_ptr + 0x408) = 0;
    bVar3 = kj::_::PromiseAwaiterBase::awaitSuspendImpl
                      ((PromiseAwaiterBase *)__return_storage_ptr__,(CoroutineBase *)this_00);
    if (bVar3) {
      return (ssize_t)local_38;
    }
    kj::_::PromiseAwaiter<void>::await_resume(__return_storage_ptr__);
    kj::_::PromiseAwaiter<void>::~PromiseAwaiter(__return_storage_ptr__);
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
              ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)this_02);
    if ((*(HttpEntityBodyWriter **)((long)handle._M_fr_ptr + 0x400))[1].super_AsyncOutputStream.
        _vptr_AsyncOutputStream == (_func_int **)0x0) {
      HttpEntityBodyWriter::doneWriting(*(HttpEntityBodyWriter **)((long)handle._M_fr_ptr + 0x400));
    }
    kj::_::CoroutineMixin<kj::_::Coroutine<void>,_void>::return_void
              ((CoroutineMixin<kj::_::Coroutine<void>,_void> *)this_00);
  }
  *(undefined8 *)handle._M_fr_ptr = 0;
  *(undefined1 *)((long)handle._M_fr_ptr + 0x408) = 1;
  return (ssize_t)local_38;
}

Assistant:

Promise<void> write(ArrayPtr<const ArrayPtr<const byte>> pieces) override {
    uint64_t size = 0;
    for (auto& piece: pieces) size += piece.size();

    if (size == 0) co_return;
    KJ_REQUIRE(size <= length, "overwrote Content-Length");
    length -= size;

    co_await getInner().writeBodyData(pieces);
    if (length == 0) doneWriting();
  }